

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::h1_d(disp *this,double param)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double in_stack_00000168;
  string *__lhs;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = local_50;
  to_string<double>(in_stack_00000168);
  std::operator+((char *)__lhs,in_RDI);
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_string_length,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void h1_d(double param)
	{
		v_= "h1_d:"+to_string(param);
	}